

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

char * fmt::v10::detail::
       parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                 (char *begin,char *end,
                 format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *handler)

{
  size_t *psVar1;
  char cVar2;
  char *pcVar3;
  long lVar4;
  char *begin_00;
  id_adapter adapter;
  id_adapter local_28;
  
  begin_00 = begin + 1;
  if (begin_00 == end) {
    throw_format_error("invalid format string");
  }
  cVar2 = *begin_00;
  if (cVar2 != '{') {
    if (cVar2 == '}') {
      compile_parse_context<char>::next_arg_id(&handler->context_);
    }
    else {
      local_28.arg_id = 0;
      local_28.handler = handler;
      if (cVar2 == ':') {
        local_28.arg_id = compile_parse_context<char>::next_arg_id(&handler->context_);
      }
      else {
        begin_00 = do_parse_arg_id<char,fmt::v10::detail::parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>(char_const*,char_const*,fmt::v10::detail::format_string_checker<char>&)::id_adapter&>
                             (begin_00,end,&local_28);
      }
      if (begin_00 == end) {
LAB_0014060a:
        throw_format_error("missing \'}\' in format string");
      }
      if (*begin_00 == ':') {
        begin_00 = begin_00 + 1;
        pcVar3 = (handler->context_).super_basic_format_parse_context<char>.format_str_.data_;
        lVar4 = (long)begin_00 - (long)pcVar3;
        if (-1 < lVar4) {
          (handler->context_).super_basic_format_parse_context<char>.format_str_.data_ =
               pcVar3 + lVar4;
          psVar1 = &(handler->context_).super_basic_format_parse_context<char>.format_str_.size_;
          *psVar1 = *psVar1 - lVar4;
          if ((begin_00 == end) || (*begin_00 != '}')) {
            throw_format_error("unknown format specifier");
          }
          goto LAB_001405d6;
        }
        goto LAB_001405f2;
      }
      if (*begin_00 != '}') goto LAB_0014060a;
    }
    pcVar3 = (handler->context_).super_basic_format_parse_context<char>.format_str_.data_;
    lVar4 = (long)begin_00 - (long)pcVar3;
    if (lVar4 < 0) {
LAB_001405f2:
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/fmtlib/repo/include/fmt/core.h"
                  ,0x189,"negative value");
    }
    (handler->context_).super_basic_format_parse_context<char>.format_str_.data_ = pcVar3 + lVar4;
    psVar1 = &(handler->context_).super_basic_format_parse_context<char>.format_str_.size_;
    *psVar1 = *psVar1 - lVar4;
  }
LAB_001405d6:
  return begin_00 + 1;
}

Assistant:

FMT_CONSTEXPR auto parse_replacement_field(const Char* begin, const Char* end,
                                           Handler&& handler) -> const Char* {
  struct id_adapter {
    Handler& handler;
    int arg_id;

    FMT_CONSTEXPR void on_auto() { arg_id = handler.on_arg_id(); }
    FMT_CONSTEXPR void on_index(int id) { arg_id = handler.on_arg_id(id); }
    FMT_CONSTEXPR void on_name(basic_string_view<Char> id) {
      arg_id = handler.on_arg_id(id);
    }
  };

  ++begin;
  if (begin == end) return handler.on_error("invalid format string"), end;
  if (*begin == '}') {
    handler.on_replacement_field(handler.on_arg_id(), begin);
  } else if (*begin == '{') {
    handler.on_text(begin, begin + 1);
  } else {
    auto adapter = id_adapter{handler, 0};
    begin = parse_arg_id(begin, end, adapter);
    Char c = begin != end ? *begin : Char();
    if (c == '}') {
      handler.on_replacement_field(adapter.arg_id, begin);
    } else if (c == ':') {
      begin = handler.on_format_specs(adapter.arg_id, begin + 1, end);
      if (begin == end || *begin != '}')
        return handler.on_error("unknown format specifier"), end;
    } else {
      return handler.on_error("missing '}' in format string"), end;
    }
  }
  return begin + 1;
}